

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O2

label_t __thiscall re2c::CpgotoTable::max_label(CpgotoTable *this)

{
  bool bVar1;
  uint32_t i;
  ulong uVar2;
  label_t max;
  label_t local_24;
  
  local_24 = label_t::first();
  for (uVar2 = 0; uVar2 < 0x100; uVar2 = uVar2 + 1) {
    bVar1 = label_t::operator<(&local_24,&this->table[uVar2]->label);
    if (bVar1) {
      local_24.value = (this->table[uVar2]->label).value;
    }
  }
  return (label_t)local_24.value;
}

Assistant:

label_t CpgotoTable::max_label () const
{
	label_t max = label_t::first ();
	for (uint32_t i = 0; i < TABLE_SIZE; ++i)
	{
		if (max < table[i]->label)
		{
			max = table[i]->label;
		};
	}
	return max;
}